

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O0

void __thiscall Analysis::FlowAnalysis(Analysis *this)

{
  bool bVar1;
  int iVar2;
  pointer pvVar3;
  void *pvVar4;
  element_type *peVar5;
  ParameterReader *this_00;
  pretty_ostream *this_01;
  string *in_RDI;
  double dVar6;
  singleParticleSpectra **ipart_1;
  iterator __end1;
  iterator __begin1;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *__range1;
  int particle_monval;
  singleParticleSpectra **ipart;
  iterator __end2;
  iterator __begin2;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *__range2;
  int nev;
  int event_id;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> spvn;
  int flag_charge_dependence;
  int compute_correlation;
  ParameterReader paraRdr;
  particleSamples *in_stack_ffffffffffffdb38;
  singleParticleSpectra *in_stack_ffffffffffffdb40;
  ParameterReader *in_stack_ffffffffffffdb48;
  ParameterReader *in_stack_ffffffffffffdb50;
  undefined4 in_stack_ffffffffffffdb88;
  undefined4 in_stack_ffffffffffffdb8c;
  ParameterReader *in_stack_ffffffffffffdb90;
  ParameterReader *in_stack_ffffffffffffdb98;
  string *psVar7;
  string *in_stack_ffffffffffffdc58;
  pretty_ostream *this_02;
  double in_stack_ffffffffffffdc70;
  allocator *value;
  string *in_stack_ffffffffffffdc78;
  ParameterReader *in_stack_ffffffffffffdc80;
  allocator *particle_list_in;
  singleParticleSpectra *this_03;
  __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
  local_1dc0;
  undefined1 *local_1db8;
  allocator<char> local_1da9;
  string local_1da8 [32];
  ParameterReader local_1d88;
  undefined1 *local_1d58;
  allocator local_1d49;
  string local_1d48 [39];
  allocator local_1d21;
  string local_1d20 [32];
  int local_1d00;
  undefined1 local_1cf9 [37];
  int local_1cd4;
  int local_1cd0;
  undefined1 local_1cc9;
  string local_1cb8 [32];
  void *local_1c98;
  allocator local_1c89;
  string local_1c88 [39];
  allocator local_1c61;
  string local_1c60 [39];
  undefined1 local_1c39;
  string local_1c28 [32];
  void *local_1c08;
  allocator local_1bf9;
  string local_1bf8 [39];
  allocator local_1bd1;
  string local_1bd0 [39];
  allocator local_1ba9;
  string local_1ba8 [39];
  allocator local_1b81;
  string local_1b80 [39];
  allocator local_1b59;
  string local_1b58 [39];
  allocator local_1b31;
  string local_1b30 [39];
  allocator local_1b09;
  string local_1b08 [39];
  allocator local_1ae1;
  string local_1ae0 [39];
  allocator local_1ab9;
  string local_1ab8 [39];
  allocator local_1a91;
  string local_1a90 [39];
  allocator local_1a69;
  string local_1a68 [39];
  allocator local_1a41;
  string local_1a40 [39];
  allocator local_1a19;
  string local_1a18 [39];
  undefined1 local_19f1 [40];
  undefined1 local_19c9;
  undefined1 local_19c8 [48];
  void *local_1998;
  allocator local_1989;
  string local_1988 [39];
  undefined1 local_1961;
  undefined1 local_1960 [48];
  ParameterReader *local_1930;
  allocator local_1921;
  string local_1920 [39];
  allocator local_18f9;
  string local_18f8 [39];
  undefined1 local_18d1;
  string local_18c0 [32];
  void *local_18a0;
  allocator local_1891;
  string local_1890 [39];
  undefined1 local_1869;
  string local_1858 [32];
  void *local_1838;
  allocator local_1829;
  string local_1828 [39];
  undefined1 local_1801;
  string local_17f0 [32];
  void *local_17d0;
  allocator local_17c1;
  string local_17c0 [39];
  undefined1 local_1799;
  string local_1788 [32];
  void *local_1768;
  allocator local_1759;
  string local_1758 [39];
  undefined1 local_1731;
  string local_1720 [32];
  void *local_1700;
  allocator local_16f1;
  string local_16f0 [39];
  allocator local_16c9;
  string local_16c8 [39];
  undefined1 local_16a1;
  string local_1690 [32];
  void *local_1670;
  allocator local_1661;
  string local_1660 [39];
  undefined1 local_1639;
  string local_1628 [32];
  void *local_1608;
  allocator local_15f9;
  string local_15f8 [39];
  undefined1 local_15d1;
  string local_15c0 [32];
  void *local_15a0;
  allocator local_1591;
  string local_1590 [39];
  undefined1 local_1569;
  string local_1558 [32];
  void *local_1538;
  allocator local_1529;
  string local_1528 [32];
  undefined7 in_stack_ffffffffffffeaf8;
  undefined1 in_stack_ffffffffffffeaff;
  undefined1 uVar8;
  string *in_stack_ffffffffffffeb00;
  ParameterReader *in_stack_ffffffffffffeb08;
  singleParticleSpectra *in_stack_ffffffffffffeb10;
  allocator local_14c1;
  string local_14c0 [39];
  undefined1 local_1499;
  string local_1488 [32];
  void *local_1468;
  allocator local_1459;
  string local_1458 [39];
  undefined1 local_1431;
  string local_1420 [32];
  void *local_1400;
  allocator local_13f1;
  string local_13f0 [39];
  allocator local_13c9;
  string local_13c8 [39];
  undefined1 local_13a1;
  string local_1390 [32];
  void *local_1370;
  allocator local_1361;
  string local_1360 [39];
  undefined1 local_1339;
  string local_1328 [32];
  void *local_1308;
  allocator local_12f9;
  string local_12f8 [39];
  undefined1 local_12d1;
  string local_12c0 [32];
  void *local_12a0;
  allocator local_1291;
  string local_1290 [39];
  undefined1 local_1269;
  string local_1258 [32];
  void *local_1238;
  allocator local_1229;
  string local_1228 [39];
  undefined1 local_1201;
  string local_11f0 [32];
  void *local_11d0;
  allocator local_11c1;
  string local_11c0 [39];
  undefined1 local_1199;
  string local_1188 [32];
  void *local_1168;
  allocator local_1159;
  string local_1158 [39];
  allocator local_1131;
  string local_1130 [39];
  allocator local_1109;
  string local_1108 [39];
  allocator local_10e1;
  string local_10e0 [39];
  allocator local_10b9;
  string local_10b8 [39];
  allocator local_1091;
  string local_1090 [39];
  allocator local_1069;
  string local_1068 [39];
  undefined1 local_1041;
  string local_1030 [32];
  void *local_1010;
  allocator local_1001;
  string local_1000 [39];
  allocator local_fd9;
  string local_fd8 [39];
  undefined1 local_fb1;
  string local_fa0 [32];
  void *local_f80;
  allocator local_f71;
  string local_f70 [39];
  allocator local_f49;
  string local_f48 [39];
  allocator local_f21;
  string local_f20 [39];
  allocator local_ef9;
  string local_ef8 [39];
  undefined1 local_ed1;
  string local_ec0 [32];
  void *local_ea0;
  allocator local_e91;
  string local_e90 [39];
  allocator local_e69;
  string local_e68 [39];
  undefined1 local_e41;
  string local_e30 [32];
  void *local_e10;
  allocator local_e01;
  string local_e00 [39];
  allocator local_dd9;
  string local_dd8 [39];
  undefined1 local_db1;
  string local_da0 [32];
  void *local_d80;
  allocator local_d71;
  string local_d70 [39];
  allocator local_d49;
  string local_d48 [39];
  undefined1 local_d21;
  string local_d10 [32];
  void *local_cf0;
  allocator local_ce1;
  string local_ce0 [39];
  allocator local_cb9;
  string local_cb8 [39];
  allocator local_c91;
  string local_c90 [39];
  allocator local_c69;
  string local_c68 [39];
  undefined1 local_c41;
  string local_c30 [32];
  void *local_c10;
  allocator local_c01;
  string local_c00 [39];
  allocator local_bd9;
  string local_bd8 [39];
  undefined1 local_bb1;
  string local_ba0 [32];
  void *local_b80;
  allocator local_b71;
  string local_b70 [39];
  allocator local_b49;
  string local_b48 [39];
  undefined1 local_b21;
  string local_b10 [32];
  void *local_af0;
  allocator local_ae1;
  string local_ae0 [39];
  allocator local_ab9;
  string local_ab8 [39];
  undefined1 local_a91;
  string local_a80 [32];
  void *local_a60;
  allocator local_a51;
  string local_a50 [39];
  allocator local_a29;
  string local_a28 [39];
  undefined1 local_a01;
  string local_9f0 [32];
  void *local_9d0;
  allocator local_9c1;
  string local_9c0 [39];
  allocator local_999;
  string local_998 [39];
  allocator local_971;
  string local_970 [39];
  allocator local_949;
  string local_948 [39];
  undefined1 local_921;
  string local_910 [32];
  void *local_8f0;
  allocator local_8e1;
  string local_8e0 [39];
  allocator local_8b9;
  string local_8b8 [39];
  allocator local_891;
  string local_890 [39];
  allocator local_869;
  string local_868 [39];
  undefined1 local_841;
  string local_830 [32];
  void *local_810;
  allocator local_801;
  string local_800 [39];
  allocator local_7d9;
  string local_7d8 [39];
  allocator local_7b1;
  string local_7b0 [39];
  allocator local_789;
  string local_788 [39];
  undefined1 local_761;
  string local_750 [32];
  void *local_730;
  allocator local_721;
  string local_720 [39];
  allocator local_6f9;
  string local_6f8 [39];
  allocator local_6d1;
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [39];
  undefined1 local_681;
  string local_670 [32];
  void *local_650;
  allocator local_641;
  string local_640 [39];
  allocator local_619;
  string local_618 [39];
  undefined1 local_5f1;
  string local_5e0 [32];
  void *local_5c0;
  allocator local_5b1;
  string local_5b0 [39];
  allocator local_589;
  string local_588 [39];
  undefined1 local_561;
  undefined1 local_560 [48];
  element_type *local_530;
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [39];
  undefined1 local_4d1;
  string local_4c0 [32];
  void *local_4a0;
  allocator local_491;
  string local_490 [39];
  allocator local_469;
  string local_468 [39];
  undefined1 local_441;
  string local_430 [32];
  void *local_410;
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [39];
  undefined1 local_3b1;
  string local_3a0 [32];
  void *local_380;
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [39];
  undefined1 local_231;
  string local_220 [32];
  pointer local_200;
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  undefined1 local_108 [31];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  int local_a0;
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [36];
  int local_3c;
  
  ParameterReader::ParameterReader(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"compute_correlation",&local_61);
  dVar6 = ParameterReader::getVal
                    (in_stack_ffffffffffffdb90,
                     (string *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
  iVar2 = (int)dVar6;
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_3c = iVar2;
  if (iVar2 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"compute_correlation",&local_99);
    ParameterReader::setVal
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"flag_charge_dependence",&local_c1);
  dVar6 = ParameterReader::getVal
                    (in_stack_ffffffffffffdb90,
                     (string *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
  iVar2 = (int)dVar6;
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  local_a0 = iVar2;
  if (iVar2 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"flag_charge_dependence",&local_e9);
    ParameterReader::setVal
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::vector
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)0x190193);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"particle_monval",&local_129);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"rap_type",&local_151);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"rapidity_distribution",&local_179);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"vn_rapidity_dis_pT_min",&local_1a1);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"vn_rapidity_dis_pT_max",&local_1c9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"rapidityPTDistributionFlag",&local_1f1);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  pvVar3 = (pointer)operator_new(0x8b8);
  local_231 = 1;
  std::__cxx11::string::string(local_220,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_231 = 0;
  local_200 = pvVar3;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1904c8);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"particle_monval",&local_259);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"rap_type",&local_281);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"rapidity_distribution",&local_2a9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"rapidityPTDistributionFlag",&local_2d1);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"rap_min",&local_2f9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"rap_max",&local_321);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"vn_rapidity_dis_pT_min",&local_349);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"vn_rapidity_dis_pT_max",&local_371);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  pvVar4 = operator_new(0x8b8);
  local_3b1 = 1;
  std::__cxx11::string::string(local_3a0,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_3b1 = 0;
  local_380 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1908e2);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"vn_rapidity_dis_pT_min",&local_3d9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"vn_rapidity_dis_pT_max",&local_401);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  pvVar4 = operator_new(0x8b8);
  local_441 = 1;
  std::__cxx11::string::string(local_430,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_441 = 0;
  local_410 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x190a7e);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"rap_min",&local_469);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"rap_max",&local_491);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  pvVar4 = operator_new(0x8b8);
  local_4d1 = 1;
  std::__cxx11::string::string(local_4c0,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_4d1 = 0;
  local_4a0 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x190c1a);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"rap_min",&local_4f9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"rap_max",&local_521);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  peVar5 = (element_type *)operator_new(0x8b8);
  local_561 = 1;
  std::__cxx11::string::string((string *)(local_560 + 0x10),in_RDI);
  this_03 = (singleParticleSpectra *)local_560;
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_561 = 0;
  local_530 = peVar5;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x190db6);
  std::__cxx11::string::~string((string *)(local_560 + 0x10));
  particle_list_in = &local_589;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_588,"rap_min",particle_list_in);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b0,"rap_max",&local_5b1);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  pvVar4 = operator_new(0x8b8);
  local_5f1 = 1;
  std::__cxx11::string::string(local_5e0,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_5f1 = 0;
  local_5c0 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x190f52);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"rap_min",&local_619);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_640,"rap_max",&local_641);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  pvVar4 = operator_new(0x8b8);
  local_681 = 1;
  std::__cxx11::string::string(local_670,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_681 = 0;
  local_650 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1910ee);
  std::__cxx11::string::~string(local_670);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"vn_rapidity_dis_pT_min",&local_6a9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d0,"vn_rapidity_dis_pT_max",&local_6d1);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f8,"rap_min",&local_6f9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"rap_max",&local_721);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  pvVar4 = operator_new(0x8b8);
  local_761 = 1;
  std::__cxx11::string::string(local_750,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_761 = 0;
  local_730 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x191362);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_788,"vn_rapidity_dis_pT_min",&local_789);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_788);
  std::allocator<char>::~allocator((allocator<char> *)&local_789);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"vn_rapidity_dis_pT_max",&local_7b1);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7d8,"rap_min",&local_7d9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_7d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_800,"rap_max",&local_801);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_800);
  std::allocator<char>::~allocator((allocator<char> *)&local_801);
  pvVar4 = operator_new(0x8b8);
  local_841 = 1;
  std::__cxx11::string::string(local_830,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_841 = 0;
  local_810 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1915d6);
  std::__cxx11::string::~string(local_830);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_868,"vn_rapidity_dis_pT_min",&local_869);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_890,"vn_rapidity_dis_pT_max",&local_891);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_890);
  std::allocator<char>::~allocator((allocator<char> *)&local_891);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8b8,"rap_min",&local_8b9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_8b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8e0,"rap_max",&local_8e1);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_8e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
  pvVar4 = operator_new(0x8b8);
  local_921 = 1;
  std::__cxx11::string::string(local_910,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_921 = 0;
  local_8f0 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19184a);
  std::__cxx11::string::~string(local_910);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_948,"vn_rapidity_dis_pT_min",&local_949);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_948);
  std::allocator<char>::~allocator((allocator<char> *)&local_949);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_970,"vn_rapidity_dis_pT_max",&local_971);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_970);
  std::allocator<char>::~allocator((allocator<char> *)&local_971);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_998,"rap_min",&local_999);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_998);
  std::allocator<char>::~allocator((allocator<char> *)&local_999);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c0,"rap_max",&local_9c1);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_9c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
  pvVar4 = operator_new(0x8b8);
  local_a01 = 1;
  std::__cxx11::string::string(local_9f0,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_a01 = 0;
  local_9d0 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x191abe);
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a28,"rap_min",&local_a29);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_a28);
  std::allocator<char>::~allocator((allocator<char> *)&local_a29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a50,"rap_max",&local_a51);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_a50);
  std::allocator<char>::~allocator((allocator<char> *)&local_a51);
  pvVar4 = operator_new(0x8b8);
  local_a91 = 1;
  std::__cxx11::string::string(local_a80,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_a91 = 0;
  local_a60 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x191c5a);
  std::__cxx11::string::~string(local_a80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ab8,"rap_min",&local_ab9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_ab8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae0,"rap_max",&local_ae1);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
  pvVar4 = operator_new(0x8b8);
  local_b21 = 1;
  std::__cxx11::string::string(local_b10,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_b21 = 0;
  local_af0 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x191df6);
  std::__cxx11::string::~string(local_b10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b48,"rap_min",&local_b49);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_b48);
  std::allocator<char>::~allocator((allocator<char> *)&local_b49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b70,"rap_max",&local_b71);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_b70);
  std::allocator<char>::~allocator((allocator<char> *)&local_b71);
  pvVar4 = operator_new(0x8b8);
  local_bb1 = 1;
  std::__cxx11::string::string(local_ba0,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_bb1 = 0;
  local_b80 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x191f92);
  std::__cxx11::string::~string(local_ba0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bd8,"rap_min",&local_bd9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_bd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c00,"rap_max",&local_c01);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_c00);
  std::allocator<char>::~allocator((allocator<char> *)&local_c01);
  pvVar4 = operator_new(0x8b8);
  local_c41 = 1;
  std::__cxx11::string::string(local_c30,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_c41 = 0;
  local_c10 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19212e);
  std::__cxx11::string::~string(local_c30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c68,"vn_rapidity_dis_pT_min",&local_c69);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_c68);
  std::allocator<char>::~allocator((allocator<char> *)&local_c69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c90,"vn_rapidity_dis_pT_max",&local_c91);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_c90);
  std::allocator<char>::~allocator((allocator<char> *)&local_c91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cb8,"rap_min",&local_cb9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce0,"rap_max",&local_ce1);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_ce0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
  pvVar4 = operator_new(0x8b8);
  local_d21 = 1;
  std::__cxx11::string::string(local_d10,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_d21 = 0;
  local_cf0 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1923a2);
  std::__cxx11::string::~string(local_d10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d48,"rap_min",&local_d49);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_d48);
  std::allocator<char>::~allocator((allocator<char> *)&local_d49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d70,"rap_max",&local_d71);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_d70);
  std::allocator<char>::~allocator((allocator<char> *)&local_d71);
  pvVar4 = operator_new(0x8b8);
  local_db1 = 1;
  std::__cxx11::string::string(local_da0,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_db1 = 0;
  local_d80 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19253e);
  std::__cxx11::string::~string(local_da0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dd8,"rap_min",&local_dd9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_dd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e00,"rap_max",&local_e01);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_e00);
  std::allocator<char>::~allocator((allocator<char> *)&local_e01);
  pvVar4 = operator_new(0x8b8);
  local_e41 = 1;
  std::__cxx11::string::string(local_e30,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_e41 = 0;
  local_e10 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1926da);
  std::__cxx11::string::~string(local_e30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e68,"rap_min",&local_e69);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_e68);
  std::allocator<char>::~allocator((allocator<char> *)&local_e69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e90,"rap_max",&local_e91);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_e90);
  std::allocator<char>::~allocator((allocator<char> *)&local_e91);
  pvVar4 = operator_new(0x8b8);
  local_ed1 = 1;
  std::__cxx11::string::string(local_ec0,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_ed1 = 0;
  local_ea0 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x192876);
  std::__cxx11::string::~string(local_ec0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ef8,"vn_rapidity_dis_pT_min",&local_ef9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_ef8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f20,"vn_rapidity_dis_pT_max",&local_f21);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_f20);
  std::allocator<char>::~allocator((allocator<char> *)&local_f21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f48,"rap_min",&local_f49);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_f48);
  std::allocator<char>::~allocator((allocator<char> *)&local_f49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f70,"rap_max",&local_f71);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_f70);
  std::allocator<char>::~allocator((allocator<char> *)&local_f71);
  pvVar4 = operator_new(0x8b8);
  local_fb1 = 1;
  std::__cxx11::string::string(local_fa0,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_fb1 = 0;
  local_f80 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x192aea);
  std::__cxx11::string::~string(local_fa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fd8,"rap_min",&local_fd9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_fd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1000,"rap_max",&local_1001);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_1000);
  std::allocator<char>::~allocator((allocator<char> *)&local_1001);
  pvVar4 = operator_new(0x8b8);
  local_1041 = 1;
  std::__cxx11::string::string(local_1030,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_1041 = 0;
  local_1010 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x192c86);
  std::__cxx11::string::~string(local_1030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1068,"rap_type",&local_1069);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_1068);
  std::allocator<char>::~allocator((allocator<char> *)&local_1069);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1090,"rapidity_distribution",&local_1091);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_1090);
  std::allocator<char>::~allocator((allocator<char> *)&local_1091);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10b8,"vn_rapidity_dis_pT_min",&local_10b9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_10b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10e0,"vn_rapidity_dis_pT_max",&local_10e1);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_10e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1108,"rap_min",&local_1109);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_1108);
  std::allocator<char>::~allocator((allocator<char> *)&local_1109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1130,"rap_max",&local_1131);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_1130);
  std::allocator<char>::~allocator((allocator<char> *)&local_1131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1158,"particle_monval",&local_1159);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_1158);
  std::allocator<char>::~allocator((allocator<char> *)&local_1159);
  pvVar4 = operator_new(0x8b8);
  local_1199 = 1;
  std::__cxx11::string::string(local_1188,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_1199 = 0;
  local_1168 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19303e);
  std::__cxx11::string::~string(local_1188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11c0,"particle_monval",&local_11c1);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_11c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11c1);
  pvVar4 = operator_new(0x8b8);
  local_1201 = 1;
  std::__cxx11::string::string(local_11f0,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_1201 = 0;
  local_11d0 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19316e);
  std::__cxx11::string::~string(local_11f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1228,"particle_monval",&local_1229);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_1228);
  std::allocator<char>::~allocator((allocator<char> *)&local_1229);
  pvVar4 = operator_new(0x8b8);
  local_1269 = 1;
  std::__cxx11::string::string(local_1258,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_1269 = 0;
  local_1238 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19329e);
  std::__cxx11::string::~string(local_1258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1290,"particle_monval",&local_1291);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_1290);
  std::allocator<char>::~allocator((allocator<char> *)&local_1291);
  pvVar4 = operator_new(0x8b8);
  local_12d1 = 1;
  std::__cxx11::string::string(local_12c0,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_12d1 = 0;
  local_12a0 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1933ce);
  std::__cxx11::string::~string(local_12c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12f8,"particle_monval",&local_12f9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_12f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12f9);
  pvVar4 = operator_new(0x8b8);
  local_1339 = 1;
  std::__cxx11::string::string(local_1328,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_1339 = 0;
  local_1308 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1934fe);
  std::__cxx11::string::~string(local_1328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1360,"particle_monval",&local_1361);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_1360);
  std::allocator<char>::~allocator((allocator<char> *)&local_1361);
  pvVar4 = operator_new(0x8b8);
  local_13a1 = 1;
  std::__cxx11::string::string(local_1390,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_13a1 = 0;
  local_1370 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19362e);
  std::__cxx11::string::~string(local_1390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13c8,"resonance_weak_feed_down_flag",&local_13c9);
  dVar6 = ParameterReader::getVal
                    (in_stack_ffffffffffffdb90,
                     (string *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
  std::__cxx11::string::~string(local_13c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13c9);
  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_13f0,"particle_monval",&local_13f1);
    ParameterReader::setVal
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
    std::__cxx11::string::~string(local_13f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_13f1);
    pvVar4 = operator_new(0x8b8);
    local_1431 = 1;
    std::__cxx11::string::string(local_1420,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
    local_1431 = 0;
    local_1400 = pvVar4;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1937e7);
    std::__cxx11::string::~string(local_1420);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1458,"particle_monval",&local_1459);
    ParameterReader::setVal
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
    std::__cxx11::string::~string(local_1458);
    std::allocator<char>::~allocator((allocator<char> *)&local_1459);
    pvVar4 = operator_new(0x8b8);
    local_1499 = 1;
    std::__cxx11::string::string(local_1488,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
    local_1499 = 0;
    local_1468 = pvVar4;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x193917);
    std::__cxx11::string::~string(local_1488);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_14c0,"particle_monval",&local_14c1);
    ParameterReader::setVal
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
    std::__cxx11::string::~string(local_14c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_14c1);
    operator_new(0x8b8);
    uVar8 = 1;
    std::__cxx11::string::string((string *)&stack0xffffffffffffeb10,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               (shared_ptr<RandomUtil::Random> *)CONCAT17(uVar8,in_stack_ffffffffffffeaf8));
    in_stack_ffffffffffffeaff = 0;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x193a47);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffeb10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1528,"particle_monval",&local_1529);
    ParameterReader::setVal
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
    std::__cxx11::string::~string(local_1528);
    std::allocator<char>::~allocator((allocator<char> *)&local_1529);
    pvVar4 = operator_new(0x8b8);
    local_1569 = 1;
    std::__cxx11::string::string(local_1558,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
    local_1569 = 0;
    local_1538 = pvVar4;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x193b77);
    std::__cxx11::string::~string(local_1558);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1590,"particle_monval",&local_1591);
    ParameterReader::setVal
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
    std::__cxx11::string::~string(local_1590);
    std::allocator<char>::~allocator((allocator<char> *)&local_1591);
    pvVar4 = operator_new(0x8b8);
    local_15d1 = 1;
    std::__cxx11::string::string(local_15c0,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
    local_15d1 = 0;
    local_15a0 = pvVar4;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x193ca7);
    std::__cxx11::string::~string(local_15c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_15f8,"particle_monval",&local_15f9);
    ParameterReader::setVal
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
    std::__cxx11::string::~string(local_15f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_15f9);
    pvVar4 = operator_new(0x8b8);
    local_1639 = 1;
    std::__cxx11::string::string(local_1628,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
    local_1639 = 0;
    local_1608 = pvVar4;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x193dd7);
    std::__cxx11::string::~string(local_1628);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1660,"particle_monval",&local_1661);
    ParameterReader::setVal
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
    std::__cxx11::string::~string(local_1660);
    std::allocator<char>::~allocator((allocator<char> *)&local_1661);
    pvVar4 = operator_new(0x8b8);
    local_16a1 = 1;
    std::__cxx11::string::string(local_1690,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
    local_16a1 = 0;
    local_1670 = pvVar4;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x193f07);
    std::__cxx11::string::~string(local_1690);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16c8,"collect_neutral_particles",&local_16c9);
  dVar6 = ParameterReader::getVal
                    (in_stack_ffffffffffffdb98,(string *)in_stack_ffffffffffffdb90,
                     (double)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
  std::__cxx11::string::~string(local_16c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16c9);
  if ((dVar6 == 1.0) && (!NAN(dVar6))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_16f0,"particle_monval",&local_16f1);
    ParameterReader::setVal
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
    std::__cxx11::string::~string(local_16f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_16f1);
    pvVar4 = operator_new(0x8b8);
    local_1731 = 1;
    std::__cxx11::string::string(local_1720,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
    local_1731 = 0;
    local_1700 = pvVar4;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1965de);
    std::__cxx11::string::~string(local_1720);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1758,"particle_monval",&local_1759);
    ParameterReader::setVal
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
    std::__cxx11::string::~string(local_1758);
    std::allocator<char>::~allocator((allocator<char> *)&local_1759);
    pvVar4 = operator_new(0x8b8);
    local_1799 = 1;
    std::__cxx11::string::string(local_1788,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
    local_1799 = 0;
    local_1768 = pvVar4;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19670e);
    std::__cxx11::string::~string(local_1788);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_17c0,"particle_monval",&local_17c1);
    ParameterReader::setVal
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
    std::__cxx11::string::~string(local_17c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_17c1);
    pvVar4 = operator_new(0x8b8);
    local_1801 = 1;
    std::__cxx11::string::string(local_17f0,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
    local_1801 = 0;
    local_17d0 = pvVar4;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19683e);
    std::__cxx11::string::~string(local_17f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1828,"particle_monval",&local_1829);
    ParameterReader::setVal
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
    std::__cxx11::string::~string(local_1828);
    std::allocator<char>::~allocator((allocator<char> *)&local_1829);
    pvVar4 = operator_new(0x8b8);
    local_1869 = 1;
    std::__cxx11::string::string(local_1858,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
    local_1869 = 0;
    local_1838 = pvVar4;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19696e);
    std::__cxx11::string::~string(local_1858);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1890,"particle_monval",&local_1891);
    ParameterReader::setVal
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
    std::__cxx11::string::~string(local_1890);
    std::allocator<char>::~allocator((allocator<char> *)&local_1891);
    pvVar4 = operator_new(0x8b8);
    local_18d1 = 1;
    std::__cxx11::string::string(local_18c0,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
    local_18d1 = 0;
    local_18a0 = pvVar4;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x196a9e);
    std::__cxx11::string::~string(local_18c0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18f8,"rap_type",&local_18f9);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_18f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_18f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1920,"particle_monval",&local_1921);
  ParameterReader::setVal
            (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70);
  std::__cxx11::string::~string(local_1920);
  std::allocator<char>::~allocator((allocator<char> *)&local_1921);
  this_00 = (ParameterReader *)operator_new(0x8b8);
  local_1961 = 1;
  std::__cxx11::string::string((string *)(local_1960 + 0x10),in_RDI);
  psVar7 = (string *)local_1960;
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_1961 = 0;
  local_1930 = this_00;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x196fda);
  std::__cxx11::string::~string((string *)(local_1960 + 0x10));
  value = &local_1989;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1988,"particle_monval",value);
  ParameterReader::setVal(this_00,psVar7,(double)value);
  std::__cxx11::string::~string(local_1988);
  std::allocator<char>::~allocator((allocator<char> *)&local_1989);
  pvVar4 = operator_new(0x8b8);
  local_19c9 = 1;
  std::__cxx11::string::string((string *)(local_19c8 + 0x10),in_RDI);
  this_02 = (pretty_ostream *)local_19c8;
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
  local_19c9 = 0;
  local_1998 = pvVar4;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19710a);
  std::__cxx11::string::~string((string *)(local_19c8 + 0x10));
  if (local_3c == 1) {
    in_stack_ffffffffffffdc58 = (string *)local_19f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_19f1 + 1),"compute_correlation",
               (allocator *)in_stack_ffffffffffffdc58);
    ParameterReader::setVal(this_00,psVar7,(double)value);
    std::__cxx11::string::~string((string *)(local_19f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_19f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a18,"flag_charge_dependence",&local_1a19);
    ParameterReader::setVal(this_00,psVar7,(double)value);
    std::__cxx11::string::~string(local_1a18);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a19);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a40,"particle_monval",&local_1a41);
    ParameterReader::setVal(this_00,psVar7,(double)value);
    std::__cxx11::string::~string(local_1a40);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a68,"rap_type",&local_1a69);
    ParameterReader::setVal(this_00,psVar7,(double)value);
    std::__cxx11::string::~string(local_1a68);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a90,"compute_corr_rap_dep",&local_1a91);
    dVar6 = ParameterReader::getVal
                      (in_stack_ffffffffffffdb90,
                       (string *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
    std::__cxx11::string::~string(local_1a90);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a91);
    if ((dVar6 != 1.0) || (NAN(dVar6))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b58,"rapidity_distribution",&local_1b59);
      ParameterReader::setVal(this_00,psVar7,(double)value);
      std::__cxx11::string::~string(local_1b58);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b59);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1ab8,"rapidity_distribution",&local_1ab9);
      ParameterReader::setVal(this_00,psVar7,(double)value);
      std::__cxx11::string::~string(local_1ab8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ab9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1ae0,"rapidity_dis_min",&local_1ae1);
      ParameterReader::setVal(this_00,psVar7,(double)value);
      std::__cxx11::string::~string(local_1ae0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ae1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b08,"rapidity_dis_max",&local_1b09);
      ParameterReader::setVal(this_00,psVar7,(double)value);
      std::__cxx11::string::~string(local_1b08);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b09);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b30,"n_rap",&local_1b31);
      ParameterReader::setVal(this_00,psVar7,(double)value);
      std::__cxx11::string::~string(local_1b30);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b31);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b80,"vn_rapidity_dis_pT_min",&local_1b81);
    ParameterReader::setVal(this_00,psVar7,(double)value);
    std::__cxx11::string::~string(local_1b80);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1ba8,"vn_rapidity_dis_pT_max",&local_1ba9);
    ParameterReader::setVal(this_00,psVar7,(double)value);
    std::__cxx11::string::~string(local_1ba8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1ba9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1bd0,"rap_min",&local_1bd1);
    ParameterReader::setVal(this_00,psVar7,(double)value);
    std::__cxx11::string::~string(local_1bd0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1bd1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1bf8,"rap_max",&local_1bf9);
    ParameterReader::setVal(this_00,psVar7,(double)value);
    std::__cxx11::string::~string(local_1bf8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1bf9);
    pvVar4 = operator_new(0x8b8);
    local_1c39 = 1;
    std::__cxx11::string::string(local_1c28,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
    local_1c39 = 0;
    local_1c08 = pvVar4;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x197c5d);
    std::__cxx11::string::~string(local_1c28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c60,"rap_min",&local_1c61);
    ParameterReader::setVal(this_00,psVar7,(double)value);
    std::__cxx11::string::~string(local_1c60);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c88,"rap_max",&local_1c89);
    ParameterReader::setVal(this_00,psVar7,(double)value);
    std::__cxx11::string::~string(local_1c88);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c89);
    pvVar4 = operator_new(0x8b8);
    local_1cc9 = 1;
    std::__cxx11::string::string(local_1cb8,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb40,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffdb38);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8));
    local_1cc9 = 0;
    local_1c98 = pvVar4;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffdb40,(value_type *)in_stack_ffffffffffffdb38);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x197df9);
    std::__cxx11::string::~string(local_1cb8);
  }
  local_1cd0 = 0;
  while( true ) {
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1980a1);
    bVar1 = particleSamples::end_of_file(in_stack_ffffffffffffdb38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_ffffffffffffdb40,(char (*) [16])in_stack_ffffffffffffdb38)
    ;
    local_1cd4 = local_1cd0 + 1;
    this_01 = pretty_ostream::operator<<
                        ((pretty_ostream *)in_stack_ffffffffffffdb40,
                         (int *)in_stack_ffffffffffffdb38);
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_ffffffffffffdb40,(char (*) [6])in_stack_ffffffffffffdb38);
    psVar7 = (string *)local_1cf9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_1cf9 + 1),"info",(allocator *)psVar7);
    pretty_ostream::flush(this_02,in_stack_ffffffffffffdc58);
    std::__cxx11::string::~string((string *)(local_1cf9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1cf9);
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x198196);
    local_1d00 = particleSamples::read_in_particle_samples
                           ((particleSamples *)in_stack_ffffffffffffdb40);
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_ffffffffffffdb40,(char (*) [7])in_stack_ffffffffffffdb38);
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_ffffffffffffdb40,(int *)in_stack_ffffffffffffdb38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d20,"info",&local_1d21);
    pretty_ostream::flush(this_02,in_stack_ffffffffffffdc58);
    std::__cxx11::string::~string(local_1d20);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d21);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d48," processing ...",&local_1d49);
    pretty_ostream::info(this_01,psVar7);
    std::__cxx11::string::~string(local_1d48);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d49);
    local_1d58 = local_108;
    local_1d88.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::
                  begin((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *
                        )in_stack_ffffffffffffdb38);
    local_1d88.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::
                  end((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
                      in_stack_ffffffffffffdb38);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                          *)in_stack_ffffffffffffdb40,
                         (__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                          *)in_stack_ffffffffffffdb38);
      if (!bVar1) break;
      local_1d88.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)__gnu_cxx::
                    __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                    ::operator*((__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                                 *)&local_1d88.values.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
      local_1d88.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           singleParticleSpectra::get_monval
                     ((singleParticleSpectra *)
                      *local_1d88.values.super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_start);
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x198359);
      particleSamples::filter_particles_from_events
                ((particleSamples *)in_stack_ffffffffffffdb40,
                 (int)((ulong)in_stack_ffffffffffffdb38 >> 0x20));
      in_stack_ffffffffffffdb50 = &local_1d88;
      std::shared_ptr<particleSamples>::shared_ptr
                ((shared_ptr<particleSamples> *)in_stack_ffffffffffffdb40,
                 (shared_ptr<particleSamples> *)in_stack_ffffffffffffdb38);
      singleParticleSpectra::calculate_Qn_vector_shell
                (this_03,(shared_ptr<particleSamples> *)particle_list_in);
      std::shared_ptr<particleSamples>::~shared_ptr((shared_ptr<particleSamples> *)0x1983b6);
      __gnu_cxx::
      __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
      ::operator++((__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                    *)&local_1d88.values.super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
    }
    in_stack_ffffffffffffdb38 = (particleSamples *)(in_RDI + 0x70);
    in_stack_ffffffffffffdb40 = (singleParticleSpectra *)&local_1da9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1da8,"done!",(allocator *)in_stack_ffffffffffffdb40);
    pretty_ostream::info(this_01,psVar7);
    std::__cxx11::string::~string(local_1da8);
    std::allocator<char>::~allocator(&local_1da9);
    local_1cd0 = local_1d00 + local_1cd0;
  }
  local_1db8 = local_108;
  local_1dc0._M_current =
       (singleParticleSpectra **)
       std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::begin
                 ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
                  in_stack_ffffffffffffdb38);
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::end
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                        *)in_stack_ffffffffffffdb40,
                       (__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                        *)in_stack_ffffffffffffdb38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
    ::operator*(&local_1dc0);
    singleParticleSpectra::output_spectra_and_Qn_results(in_stack_ffffffffffffdb40);
    __gnu_cxx::
    __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
    ::operator++(&local_1dc0);
  }
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::clear
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)0x198630);
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::~vector
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffdb50);
  ParameterReader::~ParameterReader((ParameterReader *)in_stack_ffffffffffffdb40);
  return;
}

Assistant:

void Analysis::FlowAnalysis() {
    ParameterReader paraRdr = paraRdr_;
    int compute_correlation = paraRdr.getVal("compute_correlation");
    if (compute_correlation == 1) paraRdr.setVal("compute_correlation", 0);
    int flag_charge_dependence = paraRdr.getVal("flag_charge_dependence");
    if (flag_charge_dependence == 1)
        paraRdr.setVal("flag_charge_dependence", 0);

    // first define all the analysis sets
    std::vector<singleParticleSpectra *> spvn;

    // all hadrons (99999) first (collect E_T)
    paraRdr.setVal("particle_monval", 99999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 4.);
    paraRdr.setVal("rapidityPTDistributionFlag", 1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // charged hadron first
    paraRdr.setVal("particle_monval", 9999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("rapidityPTDistributionFlag", 0);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.15);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 2.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // STAR rapidity cut
    paraRdr.setVal("rap_min", -1.0);
    paraRdr.setVal("rap_max", -0.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 0.5);
    paraRdr.setVal("rap_max", 1.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", -1.0);
    paraRdr.setVal("rap_max", 1.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ALICE rapidity cut
    paraRdr.setVal("rap_min", -0.8);
    paraRdr.setVal("rap_max", 0.8);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // STAR flow rapidity decorrelation cut
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.4);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 4.0);
    paraRdr.setVal("rap_min", -1.0);
    paraRdr.setVal("rap_max", 1.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // CMS default cut
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.3);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    paraRdr.setVal("rap_min", -2.4);
    paraRdr.setVal("rap_max", 2.4);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ATLAS UPC cut
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.4);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 2.0);
    paraRdr.setVal("rap_min", -2.5);
    paraRdr.setVal("rap_max", 2.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ATLAS default cut
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.5);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 5.0);
    paraRdr.setVal("rap_min", -2.5);
    paraRdr.setVal("rap_max", 2.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 0.5);
    paraRdr.setVal("rap_max", 2.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", -2.5);
    paraRdr.setVal("rap_max", -0.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ATLAS forward
    paraRdr.setVal("rap_min", -4.9);
    paraRdr.setVal("rap_max", -3.1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 3.1);
    paraRdr.setVal("rap_max", 4.9);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ALICE V0A
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    paraRdr.setVal("rap_min", -5.1);
    paraRdr.setVal("rap_max", -2.8);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 2.8);
    paraRdr.setVal("rap_max", 5.1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // ALICE V0C
    paraRdr.setVal("rap_min", 1.7);
    paraRdr.setVal("rap_max", 3.7);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", -3.7);
    paraRdr.setVal("rap_max", -1.7);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // PHENIX BBC
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 2.0);
    paraRdr.setVal("rap_min", -3.9);
    paraRdr.setVal("rap_max", -3.1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 3.1);
    paraRdr.setVal("rap_max", 3.9);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // now identified particle
    paraRdr.setVal("rap_type", 1);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    paraRdr.setVal("particle_monval", 211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    if (paraRdr.getVal("resonance_weak_feed_down_flag") == 0) {
        paraRdr.setVal("particle_monval", 3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 333);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }
    if (paraRdr.getVal("collect_neutral_particles", 0) == 1) {
        paraRdr.setVal("particle_monval", 111);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 311);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -311);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 2112);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -2112);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("particle_monval", 2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // lastly, if we want to compute multi-particle correlations within
    // the same UrQMD events
    if (compute_correlation == 1) {
        paraRdr.setVal("compute_correlation", 1);
        paraRdr.setVal("flag_charge_dependence", flag_charge_dependence);
        paraRdr.setVal("particle_monval", 9999);
        paraRdr.setVal("rap_type", 0);
        if (paraRdr.getVal("compute_corr_rap_dep") == 1) {
            // turn on flag to compute the rapidity dependent muti-particle
            // correlations
            paraRdr.setVal("rapidity_distribution", 1);
            paraRdr.setVal("rapidity_dis_min", -2.0);
            paraRdr.setVal("rapidity_dis_max", 2.0);
            paraRdr.setVal("n_rap", 41);
        } else {
            paraRdr.setVal("rapidity_distribution", 0);
        }
        paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
        paraRdr.setVal("vn_rapidity_dis_pT_max", 2.0);
        paraRdr.setVal("rap_min", -1.0);
        paraRdr.setVal("rap_max", 1.0);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("rap_min", -2.0);
        paraRdr.setVal("rap_max", 2.0);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }

    // start the loop
    int event_id = 0;
    while (!particle_list_->end_of_file()) {
        messager << "Reading event: " << event_id + 1 << " ... ";
        messager.flush("info");
        int nev = particle_list_->read_in_particle_samples();
        messager << "nev = " << nev;
        messager.flush("info");
        messager.info(" processing ...");
        for (auto &ipart : spvn) {
            int particle_monval = ipart->get_monval();
            particle_list_->filter_particles_from_events(particle_monval);
            ipart->calculate_Qn_vector_shell(particle_list_);
        }
        messager.info("done!");
        event_id += nev;
    }
    for (auto &ipart : spvn) ipart->output_spectra_and_Qn_results();
    spvn.clear();
}